

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

int Gia_Rsb2ManLevel(Gia_Rsb2Man_t *p)

{
  int *__ptr;
  int iVar1;
  long lVar2;
  int iVar3;
  
  (p->vLevels).nSize = 0;
  iVar3 = p->nObjs;
  __ptr = (p->vLevels).pArray;
  if ((p->vLevels).nCap < iVar3) {
    if (__ptr == (int *)0x0) {
      __ptr = (int *)malloc((long)iVar3 << 2);
    }
    else {
      __ptr = (int *)realloc(__ptr,(long)iVar3 << 2);
    }
    (p->vLevels).pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = iVar3;
  }
  iVar3 = p->iFirstPo;
  if (p->nPis + 1 < iVar3) {
    lVar2 = (long)p->nPis + 1;
    do {
      iVar3 = __ptr[lVar2 * 2 + 1] / 2;
      if (__ptr[lVar2 * 2 + 1] / 2 < __ptr[lVar2 * 2] / 2) {
        iVar3 = __ptr[lVar2 * 2] / 2;
      }
      __ptr[lVar2] = iVar3 + 1;
      lVar2 = lVar2 + 1;
      iVar3 = p->iFirstPo;
    } while (lVar2 < iVar3);
  }
  iVar1 = 0;
  if (iVar3 < p->nObjs) {
    lVar2 = (long)iVar3;
    iVar1 = 0;
    do {
      iVar3 = __ptr[lVar2 * 2] / 2;
      if (iVar1 <= iVar3) {
        iVar1 = iVar3;
      }
      __ptr[lVar2] = iVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nObjs);
  }
  return iVar1;
}

Assistant:

int Gia_Rsb2ManLevel( Gia_Rsb2Man_t * p )
{
    int i, * pLevs, Level = 0;
    Vec_IntClear( &p->vLevels );
    Vec_IntGrow( &p->vLevels, p->nObjs );
    pLevs = Vec_IntArray( &p->vLevels );
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        pLevs[i] = 1 + Abc_MaxInt( pLevs[2*i+0]/2, pLevs[2*i+1]/2 );
    for ( i = p->iFirstPo; i < p->nObjs; i++ )
        Level = Abc_MaxInt( Level, pLevs[i] = pLevs[2*i+0]/2 );
    return Level;
}